

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-cursor.c
# Opt level: O1

int read_array(coda_cursor *cursor,void *dst)

{
  ushort *puVar1;
  undefined1 uVar2;
  coda_dynamic_type_struct *pcVar3;
  coda_product_struct *pcVar4;
  coda_type *pcVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *pcVar14;
  void *dst_00;
  
  pcVar3 = cursor->stack[(long)cursor->n + -1].type;
  pcVar4 = cursor->product;
  pcVar5 = pcVar3[1].definition;
  lVar13 = (*(long *)(*(long *)&pcVar5->type_class + 0x20) >> 3) *
           *(long *)&pcVar3->definition[1].type_class;
  if ((int)pcVar5->bit_size == 0) {
    iVar12 = read_bytes((coda_product *)pcVar4[1].filename,(int64_t)pcVar5->description,lVar13,dst);
    if (iVar12 != 0) {
      return -1;
    }
  }
  else {
    pcVar6 = pcVar3->definition[1].description;
    lVar13 = lVar13 / (long)pcVar6;
    if (0 < (long)pcVar6) {
      pcVar14 = (char *)0x0;
      dst_00 = dst;
      do {
        iVar12 = read_bytes((coda_product *)pcVar4[1].filename,
                            (int64_t)((pcVar3[1].definition)->description +
                                     *(long *)&pcVar4[1].format * (long)pcVar14),lVar13,dst_00);
        if (iVar12 != 0) {
          return -1;
        }
        pcVar14 = pcVar14 + 1;
        dst_00 = (void *)((long)dst_00 + lVar13);
      } while (pcVar6 != pcVar14);
    }
  }
  lVar13 = *(long *)(*(long *)&(pcVar3[1].definition)->type_class + 0x20);
  switch(lVar13 << 0x3d | lVar13 - 8U >> 3) {
  case 0:
    break;
  case 1:
    lVar7._0_4_ = pcVar3->definition[1].type_class;
    lVar7._4_4_ = pcVar3->definition[1].read_type;
    if (0 < lVar7) {
      lVar13 = 0;
      do {
        puVar1 = (ushort *)((long)dst + lVar13 * 2);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        lVar13 = lVar13 + 1;
        lVar8._0_4_ = pcVar3->definition[1].type_class;
        lVar8._4_4_ = pcVar3->definition[1].read_type;
      } while (lVar13 < lVar8);
    }
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-cursor.c"
                  ,0x106,"int read_array(const coda_cursor *, void *)");
  case 3:
    lVar9._0_4_ = pcVar3->definition[1].type_class;
    lVar9._4_4_ = pcVar3->definition[1].read_type;
    if (0 < lVar9) {
      lVar13 = 0;
      do {
        uVar2 = *(undefined1 *)((long)dst + lVar13 * 4 + 3);
        *(undefined1 *)((long)dst + lVar13 * 4 + 3) = *(undefined1 *)((long)dst + lVar13 * 4);
        *(undefined1 *)((long)dst + lVar13 * 4) = uVar2;
        puVar1 = (ushort *)((long)dst + lVar13 * 4 + 1);
        *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
        lVar13 = lVar13 + 1;
        lVar10._0_4_ = pcVar3->definition[1].type_class;
        lVar10._4_4_ = pcVar3->definition[1].read_type;
      } while (lVar13 < lVar10);
    }
    break;
  case 7:
    lVar13._0_4_ = pcVar3->definition[1].type_class;
    lVar13._4_4_ = pcVar3->definition[1].read_type;
    if (0 < lVar13) {
      lVar13 = 0;
      do {
        swap8(dst);
        lVar13 = lVar13 + 1;
        dst = (void *)((long)dst + 8);
        lVar11._0_4_ = pcVar3->definition[1].type_class;
        lVar11._4_4_ = pcVar3->definition[1].read_type;
      } while (lVar13 < lVar11);
    }
  }
  return 0;
}

Assistant:

static int read_array(const coda_cursor *cursor, void *dst)
{
    coda_cdf_variable *variable = (coda_cdf_variable *)cursor->stack[cursor->n - 1].type;
    coda_type_class type_class;
    long record_size = variable->num_values_per_record * variable->value_size;
    int i;

    assert(variable->tag == tag_cdf_variable);
    if (variable->base_type == NULL)
    {
        type_class = variable->definition->type_class;
    }
    else
    {
        type_class = variable->base_type->definition->type_class;
    }

    for (i = 0; i < variable->num_records; i++)
    {
        /* TODO: handle sparse records */
        if (variable->offset[i] < 0)
        {
            coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "Missing record not supported for CDF variable");
            return -1;
        }
        if (variable->data != NULL)
        {
            memcpy(&((uint8_t *)dst)[i * record_size], &variable->data[variable->offset[i]], record_size);
        }
        else
        {
            if (read_bytes(((coda_cdf_product *)cursor->product)->raw_product, variable->offset[i], record_size,
                           &((uint8_t *)dst)[i * record_size]) != 0)
            {
                return -1;
            }
        }
    }
    if (type_class != coda_text_class)
    {
#ifdef WORDS_BIGENDIAN
        coda_endianness system_endianness = coda_big_endian;
#else
        coda_endianness system_endianness = coda_little_endian;
#endif
        if (((coda_cdf_product *)cursor->product)->endianness != system_endianness)
        {
            switch (variable->value_size)
            {
                case 1:
                    break;
                case 2:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap2(&((int16_t *)dst)[i]);
                    }
                    break;
                case 4:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap4(&((int32_t *)dst)[i]);
                    }
                    break;
                case 8:
                    for (i = 0; i < variable->num_records * variable->num_values_per_record; i++)
                    {
                        swap8(&((int64_t *)dst)[i]);
                    }
                    break;
                default:
                    assert(0);
                    exit(1);
            }
        }
    }

    return 0;
}